

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O1

void shared_strings_callback_string_data(void *callbackdata,XML_Char *buf,int buflen)

{
  void *pvVar1;
  long lVar2;
  size_t __n;
  
  __n = (size_t)buflen;
  pvVar1 = realloc(*(void **)((long)callbackdata + 0x20),*(long *)((long)callbackdata + 0x28) + __n)
  ;
  *(void **)((long)callbackdata + 0x20) = pvVar1;
  if (pvVar1 == (void *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = *(long *)((long)callbackdata + 0x28);
    memcpy((void *)((long)pvVar1 + lVar2),buf,__n);
    lVar2 = lVar2 + __n;
  }
  *(long *)((long)callbackdata + 0x28) = lVar2;
  return;
}

Assistant:

void shared_strings_callback_string_data (void* callbackdata, const XML_Char* buf, int buflen)
{
  struct shared_strings_callback_data* data = (struct shared_strings_callback_data*)callbackdata;
  if ((data->text = XML_Char_realloc(data->text, data->textlen + buflen)) == NULL) {
    //memory allocation error
    data->textlen = 0;
  } else {
    XML_Char_poscpy(data->text, data->textlen, buf, buflen);
    data->textlen += buflen;
  }
}